

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocb128.c
# Opt level: O0

OCB128_CONTEXT *
CRYPTO_ocb128_new(void *keyenc,void *keydec,block128_f encrypt,block128_f decrypt,ocb128_f stream)

{
  int iVar1;
  OCB128_CONTEXT *keydec_00;
  OCB128_CONTEXT *in_RCX;
  void *in_R8;
  int ret;
  OCB128_CONTEXT *octx;
  block128_f in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  keydec_00 = (OCB128_CONTEXT *)CRYPTO_malloc(0xb0,"crypto/modes/ocb128.c",0x89);
  if (keydec_00 != (OCB128_CONTEXT *)0x0) {
    iVar1 = CRYPTO_ocb128_init(in_RCX,in_R8,keydec_00,
                               (block128_f)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffffb8,(ocb128_f)0x29e6a1);
    if (iVar1 != 0) {
      return keydec_00;
    }
    CRYPTO_free(keydec_00);
  }
  return (OCB128_CONTEXT *)0x0;
}

Assistant:

OCB128_CONTEXT *CRYPTO_ocb128_new(void *keyenc, void *keydec,
                                  block128_f encrypt, block128_f decrypt,
                                  ocb128_f stream)
{
    OCB128_CONTEXT *octx;
    int ret;

    if ((octx = OPENSSL_malloc(sizeof(*octx))) != NULL) {
        ret = CRYPTO_ocb128_init(octx, keyenc, keydec, encrypt, decrypt,
                                 stream);
        if (ret)
            return octx;
        OPENSSL_free(octx);
    }

    return NULL;
}